

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O1

int __thiscall dit::anon_unknown_0::SeedBuilderTests::init(SeedBuilderTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int i;
  int extraout_EAX;
  TestNode *pTVar2;
  long lVar3;
  _func_int **local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"bool_true",
             "Seed from boolean true.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272718;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 1;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x7df80c3;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"bool_false",
             "Seed from boolean false.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272718;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x3041b39;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int8_zero",
             "Seed from int8 zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272768;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x3ba3062;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int8_one",
             "Seed from int8 one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272768;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 1;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x59906f5;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "int8_minus_one","Seed from int8 minus one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272768;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 0xff;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x6dacb35;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int16_zero",
             "Seed from int16 zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002727b8;
  *(undefined2 *)&pTVar2[1]._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x7ee822b;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int16_one",
             "Seed from int16 one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002727b8;
  *(undefined2 *)&pTVar2[1]._vptr_TestNode = 1;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x36c2f4a;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "int16_minus_one","Seed from int16 minus one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002727b8;
  *(undefined2 *)&pTVar2[1]._vptr_TestNode = 0xffff;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x46f190b;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int32_zero",
             "Seed from int32 zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272808;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x486ee5500000000;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int32_one",
             "Seed from int32 one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272808;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x5b57fd600000001;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "int32_minus_one","Seed from int32 minus one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272808;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x468612bffffffff;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint8_zero",
             "Seed from uint8 zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272858;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x374982;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint8_one",
             "Seed from uint8 one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272858;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 1;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x6147f15;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint8_max",
             "Seed from uint8 max.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272858;
  *(undefined1 *)&pTVar2[1]._vptr_TestNode = 0xff;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x557b2d5;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint16_zero",
             "Seed from uint16 zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002728a8;
  *(undefined2 *)&pTVar2[1]._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x4ac7fac;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint16_one",
             "Seed from uint16 one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002728a8;
  *(undefined2 *)&pTVar2[1]._vptr_TestNode = 1;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x2ed2cd;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint16_max",
             "Seed from uint16 max.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002728a8;
  *(undefined2 *)&pTVar2[1]._vptr_TestNode = 0xffff;
  *(undefined4 *)((long)&pTVar2[1]._vptr_TestNode + 4) = 0x72de48c;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint32_zero",
             "Seed from uint32 zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002728f8;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x271b3e900000000;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint32_one",
             "Seed from uint32 one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002728f8;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x342226a00000001;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uint32_max",
             "Seed from uint32 max.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002728f8;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x29f3c97ffffffff;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"float_zero",
             "Seed from float zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272948;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x274223100000000;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "float_negative_zero","Seed from float negative zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272948;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x6b53f8680000000;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"float_one",
             "Seed from float one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272948;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x2a4d1413f800000;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "float_negative_one","Seed from float negative one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272948;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x665ccf6bf800000;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"double_zero",
             "Seed from double zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272998;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x7f499d9;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "double_negative_zero","Seed from double negative zero.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272998;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x8000000000000000;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x335846e;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"double_one",
             "Seed from double one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272998;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x3ff0000000000000;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1030500;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "double_negative_one","Seed from double negative one.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272998;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xbff0000000000000;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x5c218b7;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ivec2_zero",
             "Seed from zero vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002729e8;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x10f5ec;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ivec3_zero",
             "Seed from zero vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272a38;
  pTVar2[1].m_testCtx = (TestContext *)0x153ee4800000000;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ivec4_zero",
             "Seed from zero vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272a88;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0x468fc51;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&local_40 + lVar3 * 4) = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,"ivec2_one","Seed from one vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_002729e8;
  pTVar2[1]._vptr_TestNode = local_40;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0xc39cfc;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&local_40 + lVar3 * 4) = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,"ivec3_one","Seed from one vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272a38;
  pTVar2[1]._vptr_TestNode = local_40;
  *(undefined4 *)&pTVar2[1].m_testCtx = uStack_38;
  *(undefined4 *)((long)&pTVar2[1].m_testCtx + 4) = 0x7fd657c;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&local_40 + lVar3 * 4) = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,"ivec4_one","Seed from one vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272a88;
  pTVar2[1]._vptr_TestNode = local_40;
  pTVar2[1].m_testCtx = (TestContext *)CONCAT44(uStack_34,uStack_38);
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0x56698d6;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ivec4_1_2_3_4"
             ,"Seed from (1, 2, 3, 4) vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272a88;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x200000001;
  pTVar2[1].m_testCtx = (TestContext *)0x400000003;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0x5ea37c;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ivec4_4_3_2_1"
             ,"Seed from (4, 3, 2, 1) vector.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272a88;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x300000004;
  pTVar2[1].m_testCtx = (TestContext *)0x100000002;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0x19b728a;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "multiple_values","Test that multiple values all change the seed.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272ad8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SeedBuilderTest<bool>(m_testCtx, true,  132088003u, "bool_true", "Seed from boolean true."));
		addChild(new SeedBuilderTest<bool>(m_testCtx, false,  50600761u, "bool_false", "Seed from boolean false."));

		addChild(new SeedBuilderTest<deInt8>(m_testCtx,  0,  62533730u, "int8_zero", "Seed from int8 zero."));
		addChild(new SeedBuilderTest<deInt8>(m_testCtx,  1,  93914869u, "int8_one", "Seed from int8 one."));
		addChild(new SeedBuilderTest<deInt8>(m_testCtx, -1, 115002165u, "int8_minus_one", "Seed from int8 minus one."));

		addChild(new SeedBuilderTest<deInt16>(m_testCtx,  0, 133071403u, "int16_zero", "Seed from int16 zero."));
		addChild(new SeedBuilderTest<deInt16>(m_testCtx,  1,  57421642u, "int16_one", "Seed from int16 one."));
		addChild(new SeedBuilderTest<deInt16>(m_testCtx, -1,  74389771u, "int16_minus_one", "Seed from int16 minus one."));

		addChild(new SeedBuilderTest<deInt32>(m_testCtx,  0, 75951701u, "int32_zero", "Seed from int32 zero."));
		addChild(new SeedBuilderTest<deInt32>(m_testCtx,  1, 95780822u, "int32_one", "Seed from int32 one."));
		addChild(new SeedBuilderTest<deInt32>(m_testCtx, -1, 73949483u, "int32_minus_one", "Seed from int32 minus one."));

		addChild(new SeedBuilderTest<deUint8>(m_testCtx, 0,		  3623298u, "uint8_zero", "Seed from uint8 zero."));
		addChild(new SeedBuilderTest<deUint8>(m_testCtx, 1,		102006549u, "uint8_one", "Seed from uint8 one."));
		addChild(new SeedBuilderTest<deUint8>(m_testCtx, 255,	 89633493u, "uint8_max", "Seed from uint8 max."));

		addChild(new SeedBuilderTest<deUint16>(m_testCtx, 0,		 78413740u, "uint16_zero", "Seed from uint16 zero."));
		addChild(new SeedBuilderTest<deUint16>(m_testCtx, 1,		  3068621u, "uint16_one", "Seed from uint16 one."));
		addChild(new SeedBuilderTest<deUint16>(m_testCtx, 65535,	120448140u, "uint16_max", "Seed from uint16 max."));

		addChild(new SeedBuilderTest<deUint32>(m_testCtx, 0u,			41006057u, "uint32_zero", "Seed from uint32 zero."));
		addChild(new SeedBuilderTest<deUint32>(m_testCtx, 1u,			54665834u, "uint32_one", "Seed from uint32 one."));
		addChild(new SeedBuilderTest<deUint32>(m_testCtx, 4294967295u,	43990167u, "uint32_max", "Seed from uint32 max."));

		addChild(new SeedBuilderTest<float>(m_testCtx, 0.0f,	 41165361u, "float_zero", "Seed from float zero."));
		addChild(new SeedBuilderTest<float>(m_testCtx, -0.0f,	112541574u, "float_negative_zero", "Seed from float negative zero."));
		addChild(new SeedBuilderTest<float>(m_testCtx, 1.0f,	 44355905u, "float_one", "Seed from float one."));
		addChild(new SeedBuilderTest<float>(m_testCtx, -1.0f,	107334902u, "float_negative_one", "Seed from float negative one."));

		addChild(new SeedBuilderTest<double>(m_testCtx, 0.0,	133470681u, "double_zero", "Seed from double zero."));
		addChild(new SeedBuilderTest<double>(m_testCtx, -0.0,	 53838958u, "double_negative_zero", "Seed from double negative zero."));
		addChild(new SeedBuilderTest<double>(m_testCtx, 1.0,	 16975104u, "double_one", "Seed from double one."));
		addChild(new SeedBuilderTest<double>(m_testCtx, -1.0,	 96606391u, "double_negative_one", "Seed from double negative one."));

		addChild(new SeedBuilderTest<IVec2>(m_testCtx, IVec2(0),	 1111532u, "ivec2_zero", "Seed from zero vector."));
		addChild(new SeedBuilderTest<IVec3>(m_testCtx, IVec3(0),	22277704u, "ivec3_zero", "Seed from zero vector."));
		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(0),	73989201u, "ivec4_zero", "Seed from zero vector."));

		addChild(new SeedBuilderTest<IVec2>(m_testCtx, IVec2(1),	 12819708u, "ivec2_one", "Seed from one vector."));
		addChild(new SeedBuilderTest<IVec3>(m_testCtx, IVec3(1),	134047100u, "ivec3_one", "Seed from one vector."));
		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(1),	 90609878u, "ivec4_one", "Seed from one vector."));

		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(1, 2, 3, 4),	 6202236u, "ivec4_1_2_3_4", "Seed from (1, 2, 3, 4) vector."));
		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(4, 3, 2, 1),	26964618u, "ivec4_4_3_2_1", "Seed from (4, 3, 2, 1) vector."));

		addChild(new SeedBuilderMultipleValuesTest(m_testCtx));
	}